

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Term.cpp
# Opt level: O3

bool __thiscall Kernel::TermList::containsAllVariablesOf(TermList *this,TermList t)

{
  _func_int **pp_Var1;
  undefined1 auVar2 [8];
  char cVar3;
  byte bVar4;
  bool bVar5;
  TermList val;
  ulong uVar6;
  size_t i;
  long lVar7;
  uint hashCode;
  bool dummy;
  TermIterator newVars;
  TermIterator oldVars;
  Set<Kernel::TermList,_Lib::DefaultHash> vars;
  bool local_69;
  undefined1 local_68 [8];
  undefined1 local_60 [8];
  Set<Kernel::TermList,_Lib::DefaultHash> local_58;
  
  local_58._capacity = 0;
  local_58._nonemptyCells = 0;
  local_58._size = 0;
  local_58._entries = (Cell *)0x0;
  Lib::Set<Kernel::TermList,_Lib::DefaultHash>::expand
            ((Set<Kernel::TermList,_Lib::DefaultHash> *)(local_60 + 8));
  Term::getVariableIterator((Term *)local_60,(TermList)this->_content);
  while( true ) {
    cVar3 = (**(code **)(*(_func_int **)local_60 + 0x10))(local_60);
    if (cVar3 == '\0') break;
    local_68 = (undefined1  [8])(**(code **)(*(_func_int **)local_60 + 0x18))(local_60);
    hashCode = 0x811c9dc5;
    lVar7 = 0;
    do {
      hashCode = ((byte)local_68[lVar7] ^ hashCode) * 0x1000193;
      lVar7 = lVar7 + 1;
    } while (lVar7 != 8);
    Lib::Set<Kernel::TermList,Lib::DefaultHash>::
    rawFindOrInsert<Lib::Set<Kernel::TermList,Lib::DefaultHash>::insert(Kernel::TermList,unsigned_int)::_lambda()_1_,Lib::Set<Kernel::TermList,Lib::DefaultHash>::insert(Kernel::TermList,unsigned_int)::_lambda(auto:1)_1_>
              ((Set<Kernel::TermList,Lib::DefaultHash> *)(local_60 + 8),(TermList *)local_68,
               hashCode,(TermList *)local_68,&local_69);
  }
  Term::getVariableIterator((Term *)local_68,t);
  auVar2 = local_68;
  do {
    bVar4 = (**(code **)(*(_func_int **)auVar2 + 0x10))(auVar2);
    if (bVar4 == 0) break;
    val._content = (**(code **)(*(_func_int **)auVar2 + 0x18))(auVar2);
    bVar5 = Lib::Set<Kernel::TermList,_Lib::DefaultHash>::contains
                      ((Set<Kernel::TermList,_Lib::DefaultHash> *)(local_60 + 8),val);
  } while (bVar5);
  pp_Var1 = (_func_int **)((long)auVar2 + 8);
  *(int *)pp_Var1 = *(int *)pp_Var1 + -1;
  if (*(int *)pp_Var1 == 0) {
    (**(code **)(*(_func_int **)auVar2 + 8))(auVar2);
  }
  pp_Var1 = (_func_int **)((long)local_60 + 8);
  *(int *)pp_Var1 = *(int *)pp_Var1 + -1;
  if (*(int *)pp_Var1 == 0) {
    (**(code **)(*(_func_int **)local_60 + 8))(local_60);
  }
  if ((anon_union_8_2_f154dc0f_for_Term_10)local_58._entries !=
      (anon_union_8_2_f154dc0f_for_Term_10)0x0) {
    if ((long)local_58._capacity == 0) {
      *(undefined8 *)local_58._entries = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_;
      Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._16_8_ = local_58._entries;
    }
    else {
      uVar6 = (long)local_58._capacity * 0x10;
      if (uVar6 < 0x11) {
        *(undefined8 *)local_58._entries = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._40_8_ = local_58._entries;
      }
      else if (uVar6 < 0x19) {
        *(undefined8 *)local_58._entries = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._64_8_ = local_58._entries;
      }
      else if (uVar6 < 0x21) {
        *(undefined8 *)local_58._entries = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._88_8_ = local_58._entries;
      }
      else if (uVar6 < 0x31) {
        *(undefined8 *)local_58._entries = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._112_8_ = local_58._entries;
      }
      else if (uVar6 < 0x41) {
        *(undefined8 *)local_58._entries = Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_;
        Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR._136_8_ = local_58._entries;
      }
      else {
        operator_delete(local_58._entries,0x10);
      }
    }
  }
  return (bool)(bVar4 ^ 1);
}

Assistant:

bool TermList::containsAllVariablesOf(TermList t) const
{
  Set<TermList> vars;
  TermIterator oldVars=Term::getVariableIterator(*this);
  while (oldVars.hasNext()) {
    vars.insert(oldVars.next());
  }
  TermIterator newVars=Term::getVariableIterator(t);
  while (newVars.hasNext()) {
    if (!vars.contains(newVars.next())) {
      return false;
    }
  }
  return true;
}